

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O2

char * max5data(curl_off_t bytes,char *max5)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  char *pcVar4;
  
  if (bytes < 100000) {
    pcVar4 = "%5ld";
  }
  else if ((ulong)bytes < 0x9c4000) {
    bytes = (ulong)bytes >> 10;
    pcVar4 = "%4ldk";
  }
  else {
    if ((ulong)bytes < 0x6400000) {
      uVar3 = (ulong)bytes >> 0x14;
      uVar1 = (ulong)((uint)bytes & 0xfffff) / 0x19999;
      pcVar4 = "%2ld.%0ldM";
LAB_0010c7c9:
      curl_msnprintf(max5,6,pcVar4,uVar3,uVar1);
      return max5;
    }
    if ((ulong)bytes >> 0x18 < 0x271) {
      bytes = (ulong)bytes >> 0x14;
      pcVar4 = "%4ldM";
    }
    else {
      uVar2 = (uint)((ulong)bytes >> 0x20);
      if ((ulong)bytes < 0x1900000000) {
        uVar3 = (ulong)bytes >> 0x1e;
        uVar1 = (ulong)((uint)bytes & 0x3ffffffe) / 0x6666666;
        pcVar4 = "%2ld.%0ldG";
        goto LAB_0010c7c9;
      }
      if (uVar2 >> 2 < 0x271) {
        bytes = (ulong)bytes >> 0x1e;
        pcVar4 = "%4ldG";
      }
      else if (uVar2 >> 0xc < 0x271) {
        bytes = (ulong)bytes >> 0x28;
        pcVar4 = "%4ldT";
      }
      else {
        bytes = (ulong)bytes >> 0x32;
        pcVar4 = "%4ldP";
      }
    }
  }
  curl_msnprintf(max5,6,pcVar4,bytes);
  return max5;
}

Assistant:

static char *max5data(curl_off_t bytes, char *max5)
{
#define ONE_KILOBYTE  CURL_OFF_T_C(1024)
#define ONE_MEGABYTE (CURL_OFF_T_C(1024) * ONE_KILOBYTE)
#define ONE_GIGABYTE (CURL_OFF_T_C(1024) * ONE_MEGABYTE)
#define ONE_TERABYTE (CURL_OFF_T_C(1024) * ONE_GIGABYTE)
#define ONE_PETABYTE (CURL_OFF_T_C(1024) * ONE_TERABYTE)

  if(bytes < CURL_OFF_T_C(100000))
    msnprintf(max5, 6, "%5" CURL_FORMAT_CURL_OFF_T, bytes);

  else if(bytes < CURL_OFF_T_C(10000) * ONE_KILOBYTE)
    msnprintf(max5, 6, "%4" CURL_FORMAT_CURL_OFF_T "k", bytes/ONE_KILOBYTE);

  else if(bytes < CURL_OFF_T_C(100) * ONE_MEGABYTE)
    /* 'XX.XM' is good as long as we're less than 100 megs */
    msnprintf(max5, 6, "%2" CURL_FORMAT_CURL_OFF_T ".%0"
              CURL_FORMAT_CURL_OFF_T "M", bytes/ONE_MEGABYTE,
              (bytes%ONE_MEGABYTE) / (ONE_MEGABYTE/CURL_OFF_T_C(10)) );

#if (CURL_SIZEOF_CURL_OFF_T > 4)

  else if(bytes < CURL_OFF_T_C(10000) * ONE_MEGABYTE)
    /* 'XXXXM' is good until we're at 10000MB or above */
    msnprintf(max5, 6, "%4" CURL_FORMAT_CURL_OFF_T "M", bytes/ONE_MEGABYTE);

  else if(bytes < CURL_OFF_T_C(100) * ONE_GIGABYTE)
    /* 10000 MB - 100 GB, we show it as XX.XG */
    msnprintf(max5, 6, "%2" CURL_FORMAT_CURL_OFF_T ".%0"
              CURL_FORMAT_CURL_OFF_T "G", bytes/ONE_GIGABYTE,
              (bytes%ONE_GIGABYTE) / (ONE_GIGABYTE/CURL_OFF_T_C(10)) );

  else if(bytes < CURL_OFF_T_C(10000) * ONE_GIGABYTE)
    /* up to 10000GB, display without decimal: XXXXG */
    msnprintf(max5, 6, "%4" CURL_FORMAT_CURL_OFF_T "G", bytes/ONE_GIGABYTE);

  else if(bytes < CURL_OFF_T_C(10000) * ONE_TERABYTE)
    /* up to 10000TB, display without decimal: XXXXT */
    msnprintf(max5, 6, "%4" CURL_FORMAT_CURL_OFF_T "T", bytes/ONE_TERABYTE);

  else
    /* up to 10000PB, display without decimal: XXXXP */
    msnprintf(max5, 6, "%4" CURL_FORMAT_CURL_OFF_T "P", bytes/ONE_PETABYTE);

    /* 16384 petabytes (16 exabytes) is the maximum a 64 bit unsigned number
       can hold, but our data type is signed so 8192PB will be the maximum. */

#else

  else
    msnprintf(max5, 6, "%4" CURL_FORMAT_CURL_OFF_T "M", bytes/ONE_MEGABYTE);

#endif

  return max5;
}